

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O0

BYTE * __thiscall
InterpreterThunkEmitter::GetNextThunk
          (InterpreterThunkEmitter *this,PVOID *ppDynamicInterpreterThunk)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  undefined4 *puVar4;
  BYTE *pBVar5;
  BYTE *thunk;
  PVOID *ppDynamicInterpreterThunk_local;
  InterpreterThunkEmitter *this_local;
  
  if (ppDynamicInterpreterThunk == (PVOID *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x124,"(ppDynamicInterpreterThunk)","ppDynamicInterpreterThunk");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (*ppDynamicInterpreterThunk != (PVOID)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x125,"(*ppDynamicInterpreterThunk == nullptr)",
                       "*ppDynamicInterpreterThunk == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->thunkCount == 0) {
    bVar2 = SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::Empty
                      (&this->freeListedThunkBlocks);
    if (!bVar2) {
      pBVar5 = AllocateFromFreeList(this,ppDynamicInterpreterThunk);
      return pBVar5;
    }
    bVar2 = NewThunkBlock(this);
    if (!bVar2) {
      if ((this->isAsmInterpreterThunk & 1U) == 0) {
        return (BYTE *)Js::InterpreterStackFrame::StaticInterpreterThunk;
      }
      return (BYTE *)Js::InterpreterStackFrame::StaticInterpreterAsmThunk;
    }
  }
  if (this->thunkBuffer == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x138,"(this->thunkBuffer != nullptr)","this->thunkBuffer != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pBVar5 = this->thunkBuffer;
  DVar3 = this->thunkCount - 1;
  this->thunkCount = DVar3;
  *ppDynamicInterpreterThunk = pBVar5 + (ulong)(DVar3 * 8) + 0x48;
  if (((ulong)*ppDynamicInterpreterThunk & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x141,"(((uintptr_t)(*ppDynamicInterpreterThunk) & 0x7) == 0)",
                       "Not 8 byte aligned?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return pBVar5;
}

Assistant:

BYTE* InterpreterThunkEmitter::GetNextThunk(PVOID* ppDynamicInterpreterThunk)
{
    Assert(ppDynamicInterpreterThunk);
    Assert(*ppDynamicInterpreterThunk == nullptr);

    if(thunkCount == 0)
    {
        if(!this->freeListedThunkBlocks.Empty())
        {
            return AllocateFromFreeList(ppDynamicInterpreterThunk);
        }
        if (!NewThunkBlock())
        {
#ifdef ASMJS_PLAT
            return this->isAsmInterpreterThunk ? (BYTE*)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk : (BYTE*)&Js::InterpreterStackFrame::StaticInterpreterThunk;
#else
            Assert(!this->isAsmInterpreterThunk);
            return (BYTE*)&Js::InterpreterStackFrame::StaticInterpreterThunk;
#endif
        }
    }

    Assert(this->thunkBuffer != nullptr);
    BYTE* thunk = this->thunkBuffer;
#if _M_ARM
    thunk = (BYTE*)((DWORD)thunk | 0x01);
#endif
    *ppDynamicInterpreterThunk = thunk + HeaderSize + ((--thunkCount) * ThunkSize);
#if _M_ARM
    AssertMsg(((uintptr_t)(*ppDynamicInterpreterThunk) & 0x6) == 0, "Not 8 byte aligned?");
#else
    AssertMsg(((uintptr_t)(*ppDynamicInterpreterThunk) & 0x7) == 0, "Not 8 byte aligned?");
#endif
    return thunk;
}